

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::OurReader::readObject(OurReader *this,Token *token)

{
  bool bVar1;
  Value *pVVar2;
  ulong uVar3;
  allocator local_1f9;
  String local_1f8;
  allocator local_1d1;
  String local_1d0;
  undefined1 local_1b0 [8];
  Token comma;
  Value *pVStack_190;
  bool ok;
  Value *local_188;
  Value *value;
  String local_178;
  undefined1 local_158 [8];
  Token colon;
  undefined1 local_120 [8];
  String msg;
  String local_f8;
  String local_d8;
  undefined1 local_b8 [8];
  Value numberName;
  undefined1 local_80 [8];
  Value init;
  String name;
  Token tokenName;
  Token *token_local;
  OurReader *this_local;
  
  std::__cxx11::string::string((string *)&init.limit_);
  Value::Value((Value *)local_80,objectValue);
  pVVar2 = currentValue(this);
  Value::swapPayload(pVVar2,(Value *)local_80);
  pVVar2 = currentValue(this);
  Value::setOffsetStart(pVVar2,(long)token->start_ - (long)this->begin_);
  do {
    bVar1 = readTokenSkippingComments(this,(Token *)((long)&name.field_2 + 8));
    if (!bVar1) {
LAB_0015916a:
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1f8,"Missing \'}\' or object member name",&local_1f9);
      this_local._7_1_ =
           addErrorAndRecover(this,&local_1f8,(Token *)((long)&name.field_2 + 8),tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      numberName.limit_._0_4_ = 1;
      goto LAB_00159226;
    }
    if ((name.field_2._8_4_ == 2) &&
       ((uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0 ||
        (((this->features_).allowTrailingCommas_ & 1U) != 0)))) {
      this_local._7_1_ = 1;
      numberName.limit_._0_4_ = 1;
      goto LAB_00159226;
    }
    std::__cxx11::string::clear();
    if (name.field_2._8_4_ == 5) {
      bVar1 = decodeString(this,(Token *)((long)&name.field_2 + 8),(String *)&init.limit_);
      if (!bVar1) {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
        numberName.limit_._0_4_ = 1;
        goto LAB_00159226;
      }
    }
    else {
      if ((name.field_2._8_4_ != 6) || (((this->features_).allowNumericKeys_ & 1U) == 0))
      goto LAB_0015916a;
      Value::Value((Value *)local_b8,nullValue);
      bVar1 = decodeNumber(this,(Token *)((long)&name.field_2 + 8),(Value *)local_b8);
      if (bVar1) {
        Value::asString_abi_cxx11_(&local_d8,(Value *)local_b8);
        std::__cxx11::string::operator=((string *)&init.limit_,(string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      else {
        this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      }
      numberName.limit_._1_3_ = 0;
      numberName.limit_._0_1_ = !bVar1;
      Value::~Value((Value *)local_b8);
      if ((uint)numberName.limit_ != 0) goto LAB_00159226;
    }
    uVar3 = std::__cxx11::string::length();
    if (0x3fffffff < uVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_f8,"keylength >= 2^30",
                 (allocator *)(msg.field_2._M_local_buf + 0xf));
      throwRuntimeError(&local_f8);
    }
    if (((this->features_).rejectDupKeys_ & 1U) != 0) {
      pVVar2 = currentValue(this);
      bVar1 = Value::isMember(pVVar2,(String *)&init.limit_);
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &colon.end_,"Duplicate key: \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &init.limit_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &colon.end_,"\'");
        std::__cxx11::string::~string((string *)&colon.end_);
        this_local._7_1_ =
             addErrorAndRecover(this,(String *)local_120,(Token *)((long)&name.field_2 + 8),
                                tokenObjectEnd);
        numberName.limit_._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_120);
        goto LAB_00159226;
      }
    }
    bVar1 = readToken(this,(Token *)local_158);
    if ((!bVar1) || (local_158._0_4_ != tokenMemberSeparator)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_178,"Missing \':\' after object member name",
                 (allocator *)((long)&value + 7));
      this_local._7_1_ = addErrorAndRecover(this,&local_178,(Token *)local_158,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_178);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value + 7));
      numberName.limit_._0_4_ = 1;
      goto LAB_00159226;
    }
    pVVar2 = currentValue(this);
    pVStack_190 = Value::operator[](pVVar2,(String *)&init.limit_);
    local_188 = pVStack_190;
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::push
              (&this->nodes_,&stack0xfffffffffffffe70);
    comma.end_._7_1_ = readValue(this);
    std::stack<Json::Value_*,_std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>_>::pop
              (&this->nodes_);
    if ((comma.end_._7_1_ & 1) == 0) {
      this_local._7_1_ = recoverFromError(this,tokenObjectEnd);
      numberName.limit_._0_4_ = 1;
      goto LAB_00159226;
    }
    bVar1 = readTokenSkippingComments(this,(Token *)local_1b0);
    if ((!bVar1) ||
       ((local_1b0._0_4_ != tokenObjectEnd && (local_1b0._0_4_ != tokenArraySeparator)))) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d0,"Missing \',\' or \'}\' in object declaration",&local_1d1);
      this_local._7_1_ = addErrorAndRecover(this,&local_1d0,(Token *)local_1b0,tokenObjectEnd);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      numberName.limit_._0_4_ = 1;
      goto LAB_00159226;
    }
  } while (local_1b0._0_4_ != tokenObjectEnd);
  this_local._7_1_ = 1;
  numberName.limit_._0_4_ = 1;
LAB_00159226:
  Value::~Value((Value *)local_80);
  std::__cxx11::string::~string((string *)&init.limit_);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool OurReader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readTokenSkippingComments(tokenName)) {
    if (tokenName.type_ == tokenObjectEnd &&
        (name.empty() ||
         features_.allowTrailingCommas_)) // empty object or trailing comma
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }
    if (name.length() >= (1U << 30))
      throwRuntimeError("keylength >= 2^30");
    if (features_.rejectDupKeys_ && currentValue().isMember(name)) {
      String msg = "Duplicate key: '" + name + "'";
      return addErrorAndRecover(msg, tokenName, tokenObjectEnd);
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readTokenSkippingComments(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}